

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O1

void __thiscall SymbolTable::SymbolTable(SymbolTable *this)

{
  u16 *puVar1;
  u64 *puVar2;
  long lVar3;
  u64 uVar4;
  u64 uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  
  uVar5 = 0;
  switchD_01306cb1::default(this->symbols,0,0x2000);
  switchD_01306cb1::default(this->hashTab,0,0x4000);
  this->nSymbols = 0;
  this->suffixLim = 0x200;
  this->terminator = 0;
  this->zeroTerminated = false;
  puVar2 = &this->symbols[0].icl;
  uVar4 = 0x10000038;
  do {
    (((Symbol *)(puVar2 + -1))->val).num = uVar5;
    *puVar2 = uVar4;
    uVar5 = uVar5 + 1;
    puVar2 = puVar2 + 2;
    uVar4 = uVar4 + 0x10000;
  } while (uVar5 != 0x100);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&this->symbols[0x100].val + lVar3) = 0;
    *(undefined8 *)((long)&this->symbols[0x100].icl + lVar3) = 0x11ff0038;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x1000);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&this->hashTab[0].val + lVar3) = 0;
    *(undefined8 *)((long)&this->hashTab[0].icl + lVar3) = 0xf1ff0000;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x4000);
  uVar6 = 0;
  uVar7 = 1;
  uVar8 = 2;
  uVar9 = 3;
  uVar10 = 4;
  uVar11 = 5;
  uVar12 = 6;
  uVar13 = 7;
  lVar3 = 0;
  do {
    puVar1 = this->byteCodes + lVar3;
    *puVar1 = uVar6 | 0x1000;
    puVar1[1] = uVar7 | 0x1000;
    puVar1[2] = uVar8 | 0x1000;
    puVar1[3] = uVar9 | 0x1000;
    puVar1[4] = uVar10 | 0x1000;
    puVar1[5] = uVar11 | 0x1000;
    puVar1[6] = uVar12 | 0x1000;
    puVar1[7] = uVar13 | 0x1000;
    lVar3 = lVar3 + 8;
    uVar6 = uVar6 + 8;
    uVar7 = uVar7 + 8;
    uVar8 = uVar8 + 8;
    uVar9 = uVar9 + 8;
    uVar10 = uVar10 + 8;
    uVar11 = uVar11 + 8;
    uVar12 = uVar12 + 8;
    uVar13 = uVar13 + 8;
  } while (lVar3 != 0x100);
  uVar6 = 0;
  uVar7 = 1;
  uVar8 = 2;
  uVar9 = 3;
  uVar10 = 4;
  uVar11 = 5;
  uVar12 = 6;
  uVar13 = 7;
  lVar3 = 0;
  do {
    puVar1 = this->shortCodes + lVar3;
    *puVar1 = uVar6 & 0xff | 0x1000;
    puVar1[1] = uVar7 & 0xff | 0x1000;
    puVar1[2] = uVar8 & 0xff | 0x1000;
    puVar1[3] = uVar9 & 0xff | 0x1000;
    puVar1[4] = uVar10 & 0xff | 0x1000;
    puVar1[5] = uVar11 & 0xff | 0x1000;
    puVar1[6] = uVar12 & 0xff | 0x1000;
    puVar1[7] = uVar13 & 0xff | 0x1000;
    lVar3 = lVar3 + 8;
    uVar6 = uVar6 + 8;
    uVar7 = uVar7 + 8;
    uVar8 = uVar8 + 8;
    uVar9 = uVar9 + 8;
    uVar10 = uVar10 + 8;
    uVar11 = uVar11 + 8;
    uVar12 = uVar12 + 8;
    uVar13 = uVar13 + 8;
  } while (lVar3 != 0x10000);
  this->lenHisto[0] = 0;
  this->lenHisto[1] = 0;
  this->lenHisto[2] = 0;
  this->lenHisto[3] = 0;
  this->lenHisto[4] = 0;
  this->lenHisto[5] = 0;
  this->lenHisto[6] = 0;
  this->lenHisto[7] = 0;
  this->lenHisto[8] = 0;
  return;
}

Assistant:

SymbolTable() : nSymbols(0), suffixLim(FSST_CODE_MAX), terminator(0), zeroTerminated(false) {
      // stuff done once at startup
      for (u32 i=0; i<256; i++) {
         symbols[i] = Symbol(i,i|(1<<FSST_LEN_BITS)); // pseudo symbols
      }
      Symbol unused = Symbol((u8) 0,FSST_CODE_MASK); // single-char symbol, exception code
      for (u32 i=256; i<FSST_CODE_MAX; i++) {
         symbols[i] = unused; // we start with all symbols unused
      }
      // empty hash table
      Symbol s;
      s.val.num = 0;
      s.icl = FSST_ICL_FREE; //marks empty in hashtab
      for(u32 i=0; i<hashTabSize; i++)
         hashTab[i] = s;

      // fill byteCodes[] with the pseudo code all bytes (escaped bytes)
      for(u32 i=0; i<256; i++)
         byteCodes[i] = (1<<FSST_LEN_BITS) | i;

      // fill shortCodes[] with the pseudo code for the first byte of each two-byte pattern
      for(u32 i=0; i<65536; i++)
         shortCodes[i] = (1<<FSST_LEN_BITS) | (i&255);

      memset(lenHisto, 0, sizeof(lenHisto)); // all unused
   }